

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndValue(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ValueType *pVVar4;
  Ch *pCVar5;
  undefined4 extraout_var;
  uint local_50;
  uint local_4c;
  SizeType i_4;
  SizeType firstMatch;
  SizeType SStack_40;
  bool oneValid;
  SizeType i_3;
  SizeType i_2;
  SizeType i_1;
  uint64_t h;
  SizeType i;
  bool patternValid;
  SizeType count;
  bool otherValid;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if (context->patternPropertiesValidatorCount != 0) {
    patternValid = false;
    i = context->patternPropertiesValidatorCount;
    if (context->objectPatternValidatorType != kPatternValidatorOnly) {
      i = i - 1;
      iVar2 = (*context->patternPropertiesValidators[i]->_vptr_ISchemaValidator[2])();
      patternValid = (bool)((byte)iVar2 & 1);
    }
    bVar1 = true;
    for (h._0_4_ = 0; (uint)h < i; h._0_4_ = (uint)h + 1) {
      uVar3 = (*context->patternPropertiesValidators[(uint)h]->_vptr_ISchemaValidator[2])();
      if ((uVar3 & 1) == 0) {
        bVar1 = false;
        break;
      }
    }
    if (context->objectPatternValidatorType == kPatternValidatorOnly) {
      if (!bVar1) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x17])
                  (context->error_handler,context->patternPropertiesValidators,(ulong)i);
        context->invalidCode = kValidateErrorPatternProperties;
        pVVar4 = GetValidateErrorKeyword(kValidateErrorPatternProperties);
        pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar4);
        context->invalidKeyword = pCVar5;
        return false;
      }
    }
    else if (context->objectPatternValidatorType == kPatternValidatorWithProperty) {
      if ((!bVar1) || (patternValid == false)) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x17])
                  (context->error_handler,context->patternPropertiesValidators,(ulong)(i + 1));
        context->invalidCode = kValidateErrorPatternProperties;
        pVVar4 = GetValidateErrorKeyword(kValidateErrorPatternProperties);
        pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar4);
        context->invalidKeyword = pCVar5;
        return false;
      }
    }
    else if ((!bVar1) && (patternValid == false)) {
      (*context->error_handler->_vptr_IValidationErrorHandler[0x17])
                (context->error_handler,context->patternPropertiesValidators,(ulong)(i + 1));
      context->invalidCode = kValidateErrorPatternProperties;
      pVVar4 = GetValidateErrorKeyword(kValidateErrorPatternProperties);
      pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pVVar4);
      context->invalidKeyword = pCVar5;
      return false;
    }
  }
  if ((this->enum_ != (uint64_t *)0x0) && (context->hasher != (void *)0x0)) {
    iVar2 = (*context->factory->_vptr_ISchemaStateFactory[5])(context->factory,context->hasher);
    i_3 = 0;
    while( true ) {
      if (this->enumCount_ <= i_3) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x1f])(context->error_handler,0x13);
        context->invalidCode = kValidateErrorEnum;
        pVVar4 = GetValidateErrorKeyword(kValidateErrorEnum);
        pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar4);
        context->invalidKeyword = pCVar5;
        return false;
      }
      if (this->enum_[i_3] == CONCAT44(extraout_var,iVar2)) break;
      i_3 = i_3 + 1;
    }
  }
  if (context->validatorCount != 0) {
    if ((this->allOf_).schemas != (SchemaType **)0x0) {
      for (SStack_40 = (this->allOf_).begin; SStack_40 < (this->allOf_).begin + (this->allOf_).count
          ; SStack_40 = SStack_40 + 1) {
        uVar3 = (*context->validators[SStack_40]->_vptr_ISchemaValidator[2])();
        if ((uVar3 & 1) == 0) {
          (*context->error_handler->_vptr_IValidationErrorHandler[0x23])
                    (context->error_handler,context->validators + (this->allOf_).begin,
                     (ulong)(this->allOf_).count);
          context->invalidCode = kValidateErrorAllOf;
          pVVar4 = GetValidateErrorKeyword(kValidateErrorAllOf);
          pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pVVar4);
          context->invalidKeyword = pCVar5;
          return false;
        }
      }
    }
    if ((this->anyOf_).schemas != (SchemaType **)0x0) {
      firstMatch = (this->anyOf_).begin;
      while( true ) {
        if ((this->anyOf_).begin + (this->anyOf_).count <= firstMatch) {
          (*context->error_handler->_vptr_IValidationErrorHandler[0x24])
                    (context->error_handler,context->validators + (this->anyOf_).begin,
                     (ulong)(this->anyOf_).count);
          context->invalidCode = kValidateErrorAnyOf;
          pVVar4 = GetValidateErrorKeyword(kValidateErrorAnyOf);
          pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pVVar4);
          context->invalidKeyword = pCVar5;
          return false;
        }
        uVar3 = (*context->validators[firstMatch]->_vptr_ISchemaValidator[2])();
        if ((uVar3 & 1) != 0) break;
        firstMatch = firstMatch + 1;
      }
    }
    if ((this->oneOf_).schemas != (SchemaType **)0x0) {
      bVar1 = false;
      local_4c = 0;
      for (local_50 = (this->oneOf_).begin; local_50 < (this->oneOf_).begin + (this->oneOf_).count;
          local_50 = local_50 + 1) {
        uVar3 = (*context->validators[local_50]->_vptr_ISchemaValidator[2])();
        if ((uVar3 & 1) != 0) {
          if (bVar1) {
            (*context->error_handler->_vptr_IValidationErrorHandler[0x26])
                      (context->error_handler,(ulong)local_4c,
                       (ulong)(local_50 - (this->oneOf_).begin));
            context->invalidCode = kValidateErrorOneOfMatch;
            pVVar4 = GetValidateErrorKeyword(kValidateErrorOneOfMatch);
            pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(pVVar4);
            context->invalidKeyword = pCVar5;
            return false;
          }
          bVar1 = true;
          local_4c = local_50 - (this->oneOf_).begin;
        }
      }
      if (!bVar1) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x25])
                  (context->error_handler,context->validators + (this->oneOf_).begin,
                   (ulong)(this->oneOf_).count);
        context->invalidCode = kValidateErrorOneOf;
        pVVar4 = GetValidateErrorKeyword(kValidateErrorOneOf);
        pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar4);
        context->invalidKeyword = pCVar5;
        return false;
      }
    }
    if ((this->not_ != (SchemaType *)0x0) &&
       (uVar3 = (*context->validators[this->notValidatorIndex_]->_vptr_ISchemaValidator[2])(),
       (uVar3 & 1) != 0)) {
      (*context->error_handler->_vptr_IValidationErrorHandler[0x27])();
      context->invalidCode = kValidateErrorNot;
      pVVar4 = GetValidateErrorKeyword(kValidateErrorNot);
      pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pVVar4);
      context->invalidKeyword = pCVar5;
      return false;
    }
  }
  return true;
}

Assistant:

RAPIDJSON_FORCEINLINE bool EndValue(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndValue");
        // Only check pattern properties if we have validators
        if (context.patternPropertiesValidatorCount > 0) {
            bool otherValid = false;
            SizeType count = context.patternPropertiesValidatorCount;
            if (context.objectPatternValidatorType != Context::kPatternValidatorOnly)
                otherValid = context.patternPropertiesValidators[--count]->IsValid();

            bool patternValid = true;
            for (SizeType i = 0; i < count; i++)
                if (!context.patternPropertiesValidators[i]->IsValid()) {
                    patternValid = false;
                    break;
                }

            if (context.objectPatternValidatorType == Context::kPatternValidatorOnly) {
                if (!patternValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (context.objectPatternValidatorType == Context::kPatternValidatorWithProperty) {
                if (!patternValid || !otherValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (!patternValid && !otherValid) { // kPatternValidatorWithAdditionalProperty)
                context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
            }
        }

        // For enums only check if we have a hasher
        if (enum_ && context.hasher) {
            const uint64_t h = context.factory.GetHashCode(context.hasher);
            for (SizeType i = 0; i < enumCount_; i++)
                if (enum_[i] == h)
                    goto foundEnum;
            context.error_handler.DisallowedValue(kValidateErrorEnum);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorEnum);
            foundEnum:;
        }

        // Only check allOf etc if we have validators
        if (context.validatorCount > 0) {
            if (allOf_.schemas)
                for (SizeType i = allOf_.begin; i < allOf_.begin + allOf_.count; i++)
                    if (!context.validators[i]->IsValid()) {
                        context.error_handler.NotAllOf(&context.validators[allOf_.begin], allOf_.count);
                        RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAllOf);
                    }

            if (anyOf_.schemas) {
                for (SizeType i = anyOf_.begin; i < anyOf_.begin + anyOf_.count; i++)
                    if (context.validators[i]->IsValid())
                        goto foundAny;
                context.error_handler.NoneOf(&context.validators[anyOf_.begin], anyOf_.count);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAnyOf);
                foundAny:;
            }

            if (oneOf_.schemas) {
                bool oneValid = false;
                SizeType firstMatch = 0;
                for (SizeType i = oneOf_.begin; i < oneOf_.begin + oneOf_.count; i++)
                    if (context.validators[i]->IsValid()) {
                        if (oneValid) {
                            context.error_handler.MultipleOneOf(firstMatch, i - oneOf_.begin);
                            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOfMatch);
                        } else {
                            oneValid = true;
                            firstMatch = i - oneOf_.begin;
                        }
                    }
                if (!oneValid) {
                    context.error_handler.NotOneOf(&context.validators[oneOf_.begin], oneOf_.count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOf);
                }
            }

            if (not_ && context.validators[notValidatorIndex_]->IsValid()) {
                context.error_handler.Disallowed();
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorNot);
            }
        }

        return true;
    }